

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::SIMDExtractOp,std::allocator<wasm::SIMDExtractOp>>>
          (Random *this,vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_> *vec)

{
  pointer pSVar1;
  pointer pSVar2;
  uint32_t uVar3;
  
  pSVar1 = (vec->super__Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (vec->super__Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1 != pSVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)pSVar2 - (long)pSVar1) >> 2));
    return (vec->super__Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>).
           _M_impl.super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::SIMDExtractOp>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }